

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ellipsoid.cpp
# Opt level: O0

HydroProp * __thiscall OpenMD::Ellipsoid::getHydroProp(Ellipsoid *this,RealType viscosity)

{
  Vector3d *pVVar1;
  double *pdVar2;
  HydroProp *this_00;
  Mat6x6d *Xi_00;
  HydroProp *pHVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  HydroProp *hprop;
  Mat6x6d Xi;
  RealType XirrB;
  RealType XirrA;
  RealType XittB;
  RealType XittA;
  RealType pi;
  RealType S;
  RealType p;
  RealType b2;
  RealType a2;
  RealType b;
  RealType a;
  Shape *in_stack_fffffffffffffc58;
  HydroProp *in_stack_fffffffffffffc60;
  Vector3d *cor;
  string local_300 [39];
  undefined1 local_2d9;
  HydroProp *local_1a0;
  RectMatrix<double,_6U,_6U> local_188;
  Vector3d *local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_18 = *(double *)(in_RDI + 0x40);
  local_20 = *(double *)(in_RDI + 0x48);
  local_28 = local_18 * local_18;
  local_30 = local_20 * local_20;
  local_38 = local_18 / local_20;
  local_10 = in_XMM0_Qa;
  if (local_38 <= 1.0) {
    dVar6 = sqrt(local_30 - local_28);
    dVar4 = sqrt(local_30 - local_28);
    local_40 = atan(dVar4 / local_18);
    local_40 = (2.0 / dVar6) * local_40;
  }
  else {
    dVar4 = sqrt(local_28 - local_30);
    dVar6 = local_18;
    dVar5 = sqrt(local_28 - local_30);
    local_40 = log((dVar6 + dVar5) / local_20);
    local_40 = (2.0 / dVar4) * local_40;
  }
  local_48 = 0x400921fb54442d18;
  local_50 = (local_10 * 50.26548245743669 * (local_28 - local_30)) /
             (((local_28 + local_28) - local_30) * local_40 - (local_18 + local_18));
  local_58 = (local_10 * 100.53096491487338 * (local_28 - local_30)) /
             ((local_28 + local_28 + local_30 * -3.0) * local_40 + local_18 + local_18);
  local_60 = (local_10 * 33.510321638291124 * (local_28 - local_30) * local_30) /
             ((local_18 + local_18) - local_30 * local_40);
  local_68 = (Vector3d *)
             ((local_10 * 33.510321638291124 * (local_28 * local_28 - local_30 * local_30)) /
             (((local_28 + local_28) - local_30) * local_40 - (local_18 + local_18)));
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)in_stack_fffffffffffffc60);
  dVar6 = local_58;
  pdVar2 = RectMatrix<double,_6U,_6U>::operator()(&local_188,0,0);
  dVar4 = local_58;
  *pdVar2 = dVar6;
  pdVar2 = RectMatrix<double,_6U,_6U>::operator()(&local_188,1,1);
  dVar6 = local_50;
  *pdVar2 = dVar4;
  pdVar2 = RectMatrix<double,_6U,_6U>::operator()(&local_188,2,2);
  *pdVar2 = dVar6;
  cor = local_68;
  this_00 = (HydroProp *)RectMatrix<double,_6U,_6U>::operator()(&local_188,3,3);
  pVVar1 = local_68;
  *(Vector3d **)&this_00->name_ = cor;
  Xi_00 = (Mat6x6d *)RectMatrix<double,_6U,_6U>::operator()(&local_188,4,4);
  dVar6 = local_60;
  (Xi_00->super_RectMatrix<double,_6U,_6U>).data_[0][0] = (double)pVVar1;
  pdVar2 = RectMatrix<double,_6U,_6U>::operator()(&local_188,5,5);
  *pdVar2 = dVar6;
  RectMatrix<double,_6U,_6U>::operator*=
            ((RectMatrix<double,_6U,_6U> *)in_stack_fffffffffffffc60,
             (double)in_stack_fffffffffffffc58);
  pHVar3 = (HydroProp *)operator_new(0x280);
  local_2d9 = 1;
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffc60,
             (Vector3<double> *)in_stack_fffffffffffffc58);
  SquareMatrix<double,_6>::SquareMatrix
            ((SquareMatrix<double,_6> *)in_stack_fffffffffffffc60,
             (SquareMatrix<double,_6> *)in_stack_fffffffffffffc58);
  HydroProp::HydroProp(this_00,cor,Xi_00);
  local_2d9 = 0;
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d69a6);
  local_1a0 = pHVar3;
  Shape::getName_abi_cxx11_(in_stack_fffffffffffffc58);
  HydroProp::setName(in_stack_fffffffffffffc60,(string *)in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_300);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3d6a12);
  return local_1a0;
}

Assistant:

HydroProp* Ellipsoid::getHydroProp(RealType viscosity) {
    RealType a  = rAxial_;
    RealType b  = rEquatorial_;
    RealType a2 = a * a;
    RealType b2 = b * b;

    RealType p = a / b;
    RealType S;
    if (p > 1.0) {
      // Ellipsoid is prolate:
      S = 2.0 / sqrt(a2 - b2) * log((a + sqrt(a2 - b2)) / b);
    } else {
      // Ellipsoid is oblate:
      S = 2.0 / sqrt(b2 - a2) * atan(sqrt(b2 - a2) / a);
    }

    RealType pi = Constants::PI;
    RealType XittA =
        16.0 * pi * viscosity * (a2 - b2) / ((2.0 * a2 - b2) * S - 2.0 * a);
    RealType XittB = 32.0 * pi * viscosity * (a2 - b2) /
                     ((2.0 * a2 - 3.0 * b2) * S + 2.0 * a);
    RealType XirrA =
        32.0 / 3.0 * pi * viscosity * (a2 - b2) * b2 / (2.0 * a - b2 * S);
    RealType XirrB = 32.0 / 3.0 * pi * viscosity * (a2 * a2 - b2 * b2) /
                     ((2.0 * a2 - b2) * S - 2.0 * a);

    Mat6x6d Xi;

    Xi(0, 0) = XittB;
    Xi(1, 1) = XittB;
    Xi(2, 2) = XittA;
    Xi(3, 3) = XirrB;
    Xi(4, 4) = XirrB;
    Xi(5, 5) = XirrA;

    Xi *= Constants::viscoConvert;

    HydroProp* hprop = new HydroProp(V3Zero, Xi);
    hprop->setName(getName());

    return hprop;
  }